

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dt-from-pseudo-root-dt.cpp
# Opt level: O2

Up __thiscall
yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoSlArrayType
          (DtFromPseudoRootDtConverter *this,PseudoDt *pseudoDt)

{
  unsigned_long_long *this_00;
  __uniq_ptr_impl<const_yactfr::StaticLengthArrayType,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
  _Var1;
  mapped_type *pmVar2;
  tuple<const_yactfr::StaticLengthArrayType_*,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
  in_RDX;
  Up *arrayType;
  Up elemDt;
  undefined1 local_50 [8];
  __uniq_ptr_impl<const_yactfr::StaticLengthArrayType,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
  local_48;
  unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_40;
  undefined1 local_34 [4];
  __uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_30;
  
  local_48._M_t.
  super__Tuple_impl<0UL,_const_yactfr::StaticLengthArrayType_*,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
  .super__Head_base<0UL,_const_yactfr::StaticLengthArrayType_*,_false>._M_head_impl =
       (tuple<const_yactfr::StaticLengthArrayType_*,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
        )((__node_base *)
         ((long)in_RDX.
                super__Tuple_impl<0UL,_const_yactfr::StaticLengthArrayType_*,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
                .super__Head_base<0UL,_const_yactfr::StaticLengthArrayType_*,_false>._M_head_impl +
         0x48))->_M_nxt;
  _tryNonNtStrTypeFromPseudoArrayType<yactfr::StaticLengthStringType,yactfr::internal::PseudoSlArrayType,unsigned_long_long>
            (this,(PseudoSlArrayType *)pseudoDt,
             (PseudoDt *)
             in_RDX.
             super__Tuple_impl<0UL,_const_yactfr::StaticLengthArrayType_*,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
             .super__Head_base<0UL,_const_yactfr::StaticLengthArrayType_*,_false>._M_head_impl,
             *(unsigned_long_long **)
              ((long)in_RDX.
                     super__Tuple_impl<0UL,_const_yactfr::StaticLengthArrayType_*,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
                     .super__Head_base<0UL,_const_yactfr::StaticLengthArrayType_*,_false>.
                     _M_head_impl + 0x40));
  if ((this->_dt)._M_t.
      super___uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
      .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl ==
      (StructureType *)0x0) {
    std::unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>::
    ~unique_ptr((unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *)
                this);
    this_00 = &(pseudoDt->_posInScope).super_type.m_storage;
    pmVar2 = std::__detail::
             _Map_base<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,(key_type *)&local_48);
    *pmVar2 = 0;
    _dtFromPseudoDt((DtFromPseudoRootDtConverter *)local_50,pseudoDt);
    local_48._M_t.
    super__Tuple_impl<0UL,_const_yactfr::StaticLengthArrayType_*,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
    .super__Head_base<0UL,_const_yactfr::StaticLengthArrayType_*,_false>._M_head_impl =
         (tuple<const_yactfr::StaticLengthArrayType_*,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
          )(tuple<const_yactfr::StaticLengthArrayType_*,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
            )in_RDX.
             super__Tuple_impl<0UL,_const_yactfr::StaticLengthArrayType_*,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
             .super__Head_base<0UL,_const_yactfr::StaticLengthArrayType_*,_false>._M_head_impl;
    std::
    _Hashtable<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase((_Hashtable<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)this_00,&local_48);
    local_34 = *(undefined1 (*) [4])
                &(((NamesToMemberTypes *)
                  ((long)in_RDX.
                         super__Tuple_impl<0UL,_const_yactfr::StaticLengthArrayType_*,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
                         .super__Head_base<0UL,_const_yactfr::StaticLengthArrayType_*,_false>.
                         _M_head_impl + 0x38))->_M_h)._M_buckets;
    local_30._M_t.
    super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
    super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl =
         (tuple<const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>)
         ((__node_base *)
         ((long)in_RDX.
                super__Tuple_impl<0UL,_const_yactfr::StaticLengthArrayType_*,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
                .super__Head_base<0UL,_const_yactfr::StaticLengthArrayType_*,_false>._M_head_impl +
         0x48))->_M_nxt;
    tryCloneAttrs((MapItem *)&local_40);
    std::
    make_unique<yactfr::StaticLengthArrayType_const,unsigned_int,std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>,unsigned_long_long,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>,bool>
              ((uint *)&local_48,
               (unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *)
               local_34,(unsigned_long_long *)local_50,
               (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               &local_30,(bool *)&local_40);
    _Var1._M_t.
    super__Tuple_impl<0UL,_const_yactfr::StaticLengthArrayType_*,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
    .super__Head_base<0UL,_const_yactfr::StaticLengthArrayType_*,_false>._M_head_impl =
         local_48._M_t.
         super__Tuple_impl<0UL,_const_yactfr::StaticLengthArrayType_*,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
         .super__Head_base<0UL,_const_yactfr::StaticLengthArrayType_*,_false>._M_head_impl;
    local_48._M_t.
    super__Tuple_impl<0UL,_const_yactfr::StaticLengthArrayType_*,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
    .super__Head_base<0UL,_const_yactfr::StaticLengthArrayType_*,_false>._M_head_impl =
         (tuple<const_yactfr::StaticLengthArrayType_*,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
          )(_Tuple_impl<0UL,_const_yactfr::StaticLengthArrayType_*,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
            )0x0;
    (this->_dt)._M_t.
    super___uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
    .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl =
         (StructureType *)
         _Var1._M_t.
         super__Tuple_impl<0UL,_const_yactfr::StaticLengthArrayType_*,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
         .super__Head_base<0UL,_const_yactfr::StaticLengthArrayType_*,_false>._M_head_impl;
    std::
    unique_ptr<const_yactfr::StaticLengthArrayType,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
    ::~unique_ptr((unique_ptr<const_yactfr::StaticLengthArrayType,_std::default_delete<const_yactfr::StaticLengthArrayType>_>
                   *)&local_48);
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              (&local_40);
    if ((_Head_base<0UL,_const_yactfr::StructureType_*,_false>)local_50 !=
        (_Head_base<0UL,_const_yactfr::StructureType_*,_false>)0x0) {
      (*(((CompoundDataType *)local_50)->super_DataType)._vptr_DataType[1])();
    }
  }
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up DtFromPseudoRootDtConverter::_dtFromPseudoSlArrayType(const PseudoDt& pseudoDt)
{
    auto& pseudoArrayType = static_cast<const PseudoSlArrayType&>(pseudoDt);

    if (auto arrayType = this->_tryNonNtStrTypeFromPseudoArrayType<StaticLengthStringType>(pseudoArrayType,
                                                                                           pseudoArrayType.pseudoElemType(),
                                                                                           pseudoArrayType.len())) {
        return arrayType;
    }

    auto elemDt = this->_whileVisitingPseudoDt(pseudoArrayType, [this](auto& pseudoArrayType) {
        return this->_dtFromPseudoDt(pseudoArrayType.pseudoElemType());
    });

    return StaticLengthArrayType::create(pseudoArrayType.minAlign(), std::move(elemDt),
                                         pseudoArrayType.len(),
                                         tryCloneAttrs(pseudoArrayType.attrs()),
                                         pseudoArrayType.hasMetadataStreamUuidRole());
}